

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

void sq_seterrorhandler(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectPtr *pSVar5;
  
  pSVar5 = SQVM::GetUp(v,-1);
  SVar2 = (pSVar5->super_SQObject)._type;
  if (((SVar2 != OT_NULL) && (SVar2 != OT_NATIVECLOSURE)) && (SVar2 != OT_CLOSURE)) {
    return;
  }
  SVar3 = (v->_errorhandler).super_SQObject._type;
  pSVar4 = (v->_errorhandler).super_SQObject._unVal.pTable;
  (v->_errorhandler).super_SQObject._unVal = (pSVar5->super_SQObject)._unVal;
  (v->_errorhandler).super_SQObject._type = SVar2;
  if ((SVar2 >> 0x1b & 1) != 0) {
    pSVar1 = &(((v->_errorhandler).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  SQVM::Pop(v);
  return;
}

Assistant:

void sq_seterrorhandler(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_isclosure(o) || sq_isnativeclosure(o) || sq_isnull(o)) {
        v->_errorhandler = o;
        v->Pop();
    }
}